

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O3

void gz_uncompress(gzFile in,FILE *out)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  FILE *pFVar7;
  gzFile pgVar8;
  char *pcVar9;
  char *pcVar10;
  ulong unaff_RBP;
  char *pcVar11;
  char *pcVar12;
  FILE *__s;
  char *pcVar13;
  gzFile unaff_R12;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  bool bVar17;
  int err;
  char buf [16384];
  undefined4 uStack_48c0;
  undefined1 uStack_48bc;
  char *pcStack_48a8;
  gzFile pgStack_48a0;
  ulong uStack_4898;
  char *pcStack_4890;
  char *pcStack_4888;
  code *pcStack_4880;
  char acStack_4878 [1024];
  FILE *pFStack_4478;
  char acStack_4450 [1024];
  gzFile pgStack_4050;
  FILE *pFStack_4048;
  code *pcStack_4040;
  char local_402c [4];
  char local_4028 [16392];
  
  do {
    pcStack_4040 = (code *)0x101600;
    pcVar11 = local_4028;
    uVar3 = gzread(in,local_4028,0x4000);
    if ((int)uVar3 < 0) {
      pcVar11 = local_402c;
      pcStack_4040 = (code *)0x101656;
      __s = (FILE *)in;
      gz_uncompress_cold_4();
      goto LAB_00101656;
    }
    if (uVar3 == 0) goto LAB_00101623;
    unaff_RBP = (ulong)uVar3;
    pcVar11 = (char *)0x1;
    pcStack_4040 = (code *)0x10161a;
    sVar6 = fwrite(local_4028,1,(ulong)uVar3,(FILE *)out);
  } while (uVar3 == (uint)sVar6);
  pcStack_4040 = (code *)0x101623;
  gz_uncompress_cold_1();
LAB_00101623:
  pcStack_4040 = (code *)0x10162b;
  __s = out;
  iVar4 = fclose((FILE *)out);
  if (iVar4 == 0) {
    pcStack_4040 = (code *)0x101637;
    __s = (FILE *)in;
    iVar4 = gzclose();
    if (iVar4 == 0) {
      return;
    }
  }
  else {
LAB_00101656:
    pcStack_4040 = (code *)0x10165b;
    gz_uncompress_cold_2();
  }
  pcStack_4040 = file_compress;
  gz_uncompress_cold_3();
  pcVar10 = acStack_4450;
  pcVar12 = pcVar11;
  pgStack_4050 = in;
  pFStack_4048 = out;
  pcStack_4040 = (code *)local_4028;
  sVar6 = strlen((char *)__s);
  if (sVar6 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_4450,0x400,"%s%s",__s,".gz");
    pcVar12 = "rb";
    pFVar7 = fopen64((char *)__s,"rb");
    if (pFVar7 == (FILE *)0x0) goto LAB_001016f1;
    pcVar12 = pcVar11;
    pgVar8 = (gzFile)gzopen64(acStack_4450);
    if (pgVar8 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar7,pgVar8);
      unlink((char *)__s);
      return;
    }
  }
  file_compress_cold_1();
  pcVar16 = acStack_4878;
  pcStack_4880 = (code *)0x101719;
  pFStack_4478 = __s;
  pcVar9 = (char *)strlen(pcVar10);
  uVar14 = (ulong)pcVar9 & 0xffffffff;
  if (uVar14 < 0x3fd) {
    unaff_R12 = (gzFile)0x400;
    pcStack_4880 = (code *)0x10174e;
    snprintf(acStack_4878,0x400,"%s",pcVar10);
    if ((uint)pcVar9 < 4) {
LAB_0010176c:
      unaff_R12 = (gzFile)(0x400 - uVar14);
      pcStack_4880 = (code *)0x10178b;
      snprintf(acStack_4878 + uVar14,(size_t)unaff_R12,"%s",".gz");
      pcVar11 = acStack_4878;
      pcVar16 = pcVar10;
    }
    else {
      pcStack_4880 = (code *)0x101768;
      iVar4 = strcmp(pcVar10 + (uVar14 - 3),".gz");
      if (iVar4 != 0) goto LAB_0010176c;
      acStack_4878[(uint)pcVar9 - 3] = '\0';
      pcVar11 = pcVar10;
    }
    pcVar12 = "rb";
    pcStack_4880 = (code *)0x10179d;
    pgVar8 = (gzFile)gzopen64(pcVar11);
    pcVar9 = pcVar16;
    if (pgVar8 == (gzFile)0x0) goto LAB_001017f3;
    pcVar12 = "wb";
    pcStack_4880 = (code *)0x1017b4;
    pFVar7 = fopen64(pcVar16,"wb");
    if (pFVar7 != (FILE *)0x0) {
      pcStack_4880 = (code *)0x1017c4;
      gz_uncompress(pgVar8,(FILE *)pFVar7);
      pcStack_4880 = (code *)0x1017cc;
      unlink(pcVar11);
      return;
    }
  }
  else {
    pcStack_4880 = (code *)0x1017f3;
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar8 = unaff_R12;
    pcStack_4880 = (code *)0x1017fb;
    file_uncompress_cold_2();
  }
  pcStack_4880 = main;
  pcVar13 = pcVar10;
  file_uncompress_cold_1();
  uVar15 = (ulong)pcVar13 & 0xffffffff;
  uStack_48bc = 0;
  uStack_48c0 = 0x20366277;
  pcVar16 = *(char **)pcVar12;
  prog = pcVar16;
  pcStack_48a8 = pcVar10;
  pgStack_48a0 = pgVar8;
  uStack_4898 = uVar14;
  pcStack_4890 = pcVar11;
  pcStack_4888 = pcVar9;
  pcStack_4880 = (code *)unaff_RBP;
  pcVar10 = strrchr(pcVar16,0x2f);
  pcVar11 = pcVar10 + 1;
  if (pcVar10 == (char *)0x0) {
    pcVar11 = pcVar16;
  }
  iVar4 = strcmp(pcVar11,"gunzip");
  if (iVar4 == 0) {
    bVar17 = true;
    bVar1 = false;
  }
  else {
    iVar4 = strcmp(pcVar11,"zcat");
    bVar17 = iVar4 == 0;
    bVar1 = bVar17;
  }
  pcVar12 = pcVar12 + 8;
  iVar4 = (int)pcVar13 + -1;
  if ((int)pcVar13 < 2) {
LAB_0010193b:
    uStack_48c0 = uStack_48c0 & 0xffffff;
  }
  else {
    cVar2 = ' ';
    do {
      pcVar11 = *(char **)pcVar12;
      if (*pcVar11 != '-') goto LAB_00101937;
      if ((pcVar11[1] == 'c') && (pcVar11[2] == '\0')) {
        bVar1 = true;
      }
      else if ((pcVar11[1] == 'd') && (pcVar11[2] == '\0')) {
        bVar17 = true;
      }
      else if ((pcVar11[1] == 'f') && (pcVar11[2] == '\0')) {
        uStack_48c0 = CONCAT13(0x66,(undefined3)uStack_48c0);
        cVar2 = 'f';
      }
      else if ((pcVar11[1] == 'h') && (pcVar11[2] == '\0')) {
        uStack_48c0 = CONCAT13(0x68,(undefined3)uStack_48c0);
        cVar2 = 'h';
      }
      else if ((pcVar11[1] == 'r') && (pcVar11[2] == '\0')) {
        uStack_48c0 = CONCAT13(0x52,(undefined3)uStack_48c0);
        cVar2 = 'R';
      }
      else {
        if (8 < (byte)(pcVar11[1] - 0x31U)) goto LAB_00101937;
        if (pcVar11[2] != '\0') {
          iVar4 = (int)uVar15 + -1;
          goto LAB_00101937;
        }
        uStack_48c0._0_3_ = CONCAT12(pcVar11[1],(undefined2)uStack_48c0);
      }
      pcVar12 = pcVar12 + 8;
      iVar4 = iVar4 + -1;
      uVar3 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar3;
    } while (1 < (int)uVar3);
    iVar4 = 0;
LAB_00101937:
    if (cVar2 == ' ') goto LAB_0010193b;
  }
  if (iVar4 == 0) {
    if (bVar17) {
      iVar4 = fileno(_stdin);
      pgVar8 = (gzFile)gzdopen(iVar4,"rb");
      if (pgVar8 == (gzFile)0x0) {
LAB_00101a73:
        main_cold_3();
LAB_00101a78:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar8,(FILE *)_stdout);
    }
    else {
      iVar4 = fileno(_stdout);
      pgVar8 = (gzFile)gzdopen(iVar4,&uStack_48c0);
      if (pgVar8 == (gzFile)0x0) goto LAB_00101a78;
      gz_compress((FILE *)_stdin,pgVar8);
    }
  }
  else {
    do {
      pcVar11 = *(char **)pcVar12;
      if (bVar17) {
        if (bVar1) {
          pgVar8 = (gzFile)gzopen64(pcVar11,"rb");
          if (pgVar8 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar8,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar11);
        }
      }
      else if (bVar1) {
        pFVar7 = fopen64(pcVar11,"rb");
        if (pFVar7 == (FILE *)0x0) {
          perror(*(char **)pcVar12);
        }
        else {
          iVar5 = fileno(_stdout);
          pgVar8 = (gzFile)gzdopen(iVar5,&uStack_48c0);
          if (pgVar8 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101a73;
          }
          gz_compress((FILE *)pFVar7,pgVar8);
        }
      }
      else {
        file_compress(pcVar11,(char *)&uStack_48c0);
      }
      pcVar12 = pcVar12 + 8;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void gz_uncompress(in, out)
    gzFile in;
    FILE   *out;
{
    local char buf[BUFLEN];
    int len;
    int err;

    for (;;) {
        len = gzread(in, buf, sizeof(buf));
        if (len < 0) error (gzerror(in, &err));
        if (len == 0) break;

        if ((int)fwrite(buf, 1, (unsigned)len, out) != len) {
            error("failed fwrite");
        }
    }
    if (fclose(out)) error("failed fclose");

    if (gzclose(in) != Z_OK) error("failed gzclose");
}